

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O1

void __thiscall FTagManager::AddLineID(FTagManager *this,int line,int tag)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  FTagItem *pFVar4;
  uint i;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  bool bVar8;
  
  if (tag != -1) {
    if ((this->startForLine).Count <= (uint)line) {
      do {
        TArray<int,_int>::Grow(&this->startForLine,1);
        (this->startForLine).Array[(this->startForLine).Count] = -1;
        uVar5 = (this->startForLine).Count + 1;
        (this->startForLine).Count = uVar5;
      } while (uVar5 <= (uint)line);
    }
    piVar7 = (this->startForLine).Array;
    uVar5 = piVar7[line];
    uVar6 = (ulong)uVar5;
    uVar2 = (this->allIDs).Count;
    if (uVar6 == 0xffffffff) {
      piVar7[line] = uVar2;
    }
    else {
      bVar8 = uVar5 < uVar2;
      if (bVar8) {
        pFVar4 = (this->allIDs).Array;
        if (pFVar4[uVar6].tag != tag) {
          piVar7 = &pFVar4[uVar6 + 1].tag;
          do {
            if (uVar2 - 1 == (int)uVar6) goto LAB_004589e7;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            iVar3 = *piVar7;
            piVar7 = piVar7 + 3;
          } while (iVar3 != tag);
          bVar8 = uVar5 < uVar2;
        }
        if (bVar8) {
          return;
        }
      }
    }
LAB_004589e7:
    TArray<FTagItem,_FTagItem>::Grow(&this->allIDs,1);
    pFVar4 = (this->allIDs).Array;
    uVar5 = (this->allIDs).Count;
    pFVar4[uVar5].target = line;
    pFVar4[uVar5].tag = tag;
    pFVar4[uVar5].nexttag = -1;
    puVar1 = &(this->allIDs).Count;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void FTagManager::AddLineID(int line, int tag)
{
	if (tag == -1) return;	// For line IDs -1 means 'not set', unlike sectors.

	// This function assumes that all ids for a single line get added sequentially.
	while (startForLine.Size() <= (unsigned int)line)
	{
		startForLine.Push(-1);
	}
	if (startForLine[line] == -1)
	{
		startForLine[line] = allIDs.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForLine[line]; i < allIDs.Size(); i++)
		{
			if (allIDs[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { line, tag, -1 };
	allIDs.Push(it);
}